

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
SignedBytesEqualFailure::SignedBytesEqualFailure
          (SignedBytesEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          char expected,char actual,SimpleString *text)

{
  undefined1 local_100 [72];
  SimpleString expectedReported;
  SimpleString local_90;
  undefined1 local_80 [8];
  SimpleString actualReported;
  SimpleString eDecimal;
  SimpleString aDecimal;
  undefined1 local_40 [30];
  char actual_local;
  char expected_local;
  size_t lineNumber_local;
  char *fileName_local;
  UtestShell *test_local;
  SignedBytesEqualFailure *this_local;
  
  local_40[0x16] = actual;
  local_40[0x17] = expected;
  unique0x100004a4 = (char *)lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = (char *)test;
  test_local = (UtestShell *)this;
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__SignedBytesEqualFailure_00189b58
  ;
  TestFailure::createUserText((TestFailure *)local_40,(SimpleString *)this);
  SimpleString::operator=(&(this->super_TestFailure).message_,(SimpleString *)local_40);
  SimpleString::~SimpleString((SimpleString *)local_40);
  ::StringFrom((int)&eDecimal + 8);
  ::StringFrom((int)&actualReported + 8);
  SimpleString::padStringsToSameLength
            ((SimpleString *)&eDecimal.bufferSize_,(SimpleString *)&actualReported.bufferSize_,' ');
  SimpleString::SimpleString((SimpleString *)&stack0xffffffffffffff60," ");
  SimpleString::operator+(&local_90,(SimpleString *)&eDecimal.bufferSize_);
  BracketsFormattedHexStringFrom((char)&expectedReported + '\b');
  SimpleString::operator+((SimpleString *)local_80,&local_90);
  SimpleString::~SimpleString((SimpleString *)&expectedReported.bufferSize_);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffff60);
  SimpleString::SimpleString((SimpleString *)(local_100 + 0x20)," ");
  SimpleString::operator+
            ((SimpleString *)(local_100 + 0x30),(SimpleString *)&actualReported.bufferSize_);
  BracketsFormattedHexStringFrom((char)local_100 + '\x10');
  SimpleString::operator+((SimpleString *)(local_100 + 0x40),(SimpleString *)(local_100 + 0x30));
  SimpleString::~SimpleString((SimpleString *)(local_100 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_100 + 0x30));
  SimpleString::~SimpleString((SimpleString *)(local_100 + 0x20));
  TestFailure::createButWasString
            ((TestFailure *)local_100,(SimpleString *)this,(SimpleString *)(local_100 + 0x40));
  SimpleString::operator+=(&(this->super_TestFailure).message_,(SimpleString *)local_100);
  SimpleString::~SimpleString((SimpleString *)local_100);
  SimpleString::~SimpleString((SimpleString *)(local_100 + 0x40));
  SimpleString::~SimpleString((SimpleString *)local_80);
  SimpleString::~SimpleString((SimpleString *)&actualReported.bufferSize_);
  SimpleString::~SimpleString((SimpleString *)&eDecimal.bufferSize_);
  return;
}

Assistant:

SignedBytesEqualFailure::SignedBytesEqualFailure (UtestShell* test, const char* fileName, size_t lineNumber, signed char expected, signed char actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom((int)actual);
    SimpleString eDecimal = StringFrom((int)expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');

    SimpleString actualReported = aDecimal + " " + BracketsFormattedHexStringFrom(actual);
    SimpleString expectedReported = eDecimal + " " + BracketsFormattedHexStringFrom(expected);
    message_ += createButWasString(expectedReported, actualReported);
}